

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

char * make_signed_hex_str_8(uint val)

{
  uint val_local;
  
  if ((val & 0xff) == 0x80) {
    sprintf(make_signed_hex_str_8::str,"-$80");
  }
  else if ((val & 0x80) == 0) {
    sprintf(make_signed_hex_str_8::str,"$%x",(ulong)(val & 0x7f));
  }
  else {
    sprintf(make_signed_hex_str_8::str,"-$%x",(ulong)(-(val & 0xff) & 0x7f));
  }
  return make_signed_hex_str_8::str;
}

Assistant:

static char* make_signed_hex_str_8(uint val)
{
	static char str[20];

	val &= 0xff;

	if(val == 0x80)
		sprintf(str, "-$80");
	else if(val & 0x80)
		sprintf(str, "-$%x", (0-val) & 0x7f);
	else
		sprintf(str, "$%x", val & 0x7f);

	return str;
}